

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O1

axbStatus_t
axbVecAXPBYPCZ(axbVec_s *z,axbScalar_s *alpha,axbScalar_s *beta,axbScalar_s *gamma,axbVec_s *x,
              axbVec_s *y)

{
  if (x->init == 0x1d232) {
    if (y->init == 0x1d232) {
      if (z->init == 0x1d232) {
        (*z->opBackend->op_table[0x12].func)();
        return 0;
      }
      axbVecAXPBYPCZ_cold_3();
    }
    else {
      axbVecAXPBYPCZ_cold_2();
    }
  }
  else {
    axbVecAXPBYPCZ_cold_1();
  }
  return 0x1d232;
}

Assistant:

axbStatus_t axbVecAXPBYPCZ(struct axbVec_s *z, const struct axbScalar_s *alpha, const struct axbScalar_s *beta, const struct axbScalar_s *gamma, const struct axbVec_s *x, const struct axbVec_s *y)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);
  AXB_VECTOR_INIT_CHECK(z);

  axbOpDescriptor_t op_desc = z->opBackend->op_table[AXB_OP_VEC_AXPBYPCZ];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbVec_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbScalar_s *, const struct axbVec_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(z, alpha, beta, gamma, x, y, op_desc.func_data);
  return 0;
}